

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O1

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,Script *script,
          string *bech32_hrp)

{
  _Rb_tree_header *p_Var1;
  NetType_conflict NVar2;
  AddressType local_4c;
  CfdSourceLocation local_48;
  
  NVar2 = kCfdConnectionError;
  if (bech32_hrp->_M_string_length == 0) {
    NVar2 = type;
  }
  this->type_ = NVar2;
  this->addr_type_ = kP2wshAddress;
  this->witness_ver_ = witness_ver;
  (this->address_)._M_dataplus._M_p = (pointer)&(this->address_).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->address_,"");
  ByteData::ByteData(&this->hash_);
  Pubkey::Pubkey(&this->pubkey_);
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_,script);
  p_Var1 = &(this->format_data_).map_._M_t._M_impl.super__Rb_tree_header;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->format_data_).map_._M_t._M_impl = 0;
  *(undefined8 *)&(this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  CalculateP2WSH(this,bech32_hrp);
  local_48.filename = "cfdcore_address.cpp";
  local_48.line = 0x1eb;
  local_48.funcname = "Address";
  local_4c = kP2wshAddress;
  logger::log<cfd::core::NetType&,cfd::core::AddressType&,std::__cxx11::string_const&>
            (&local_48,kCfdLogLevelInfo,"call Address({},{},{})",&this->type_,&local_4c,bech32_hrp);
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const Script& script,
    const std::string& bech32_hrp)
    : type_((!bech32_hrp.empty()) ? kCustomChain : type),
      addr_type_(AddressType::kP2wshAddress),
      witness_ver_(witness_ver),
      address_(""),
      hash_(),
      pubkey_(),
      schnorr_pubkey_(),
      redeem_script_(script) {
  memset(checksum_, 0, sizeof(checksum_));
  CalculateP2WSH(bech32_hrp);
  info(
      CFD_LOG_SOURCE, "call Address({},{},{})", type_,
      AddressType::kP2wshAddress, bech32_hrp);
}